

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_list.cpp
# Opt level: O0

bool __thiscall
Am_Priority_List::Two_List_Get_Next
          (Am_Priority_List *this,Am_Priority_List *other_list,Am_Object *inter,float *priority)

{
  float *pfVar1;
  float fVar2;
  float *priority_local;
  Am_Object *inter_local;
  Am_Priority_List *other_list_local;
  Am_Priority_List *this_local;
  
  if (this->current == (Am_Priority_List_Item *)0x0) {
    if ((other_list == (Am_Priority_List *)0x0) ||
       (other_list->current == (Am_Priority_List_Item *)0x0)) {
      return false;
    }
    Am_Object::operator=(inter,&other_list->current->obj);
    *priority = other_list->current->main_priority;
    other_list->current = other_list->current->next;
  }
  else if ((other_list == (Am_Priority_List *)0x0) ||
          (other_list->current == (Am_Priority_List_Item *)0x0)) {
    Am_Object::operator=(inter,&this->current->obj);
    *priority = this->current->main_priority;
    this->current = this->current->next;
  }
  else {
    if (this->current->main_priority <= other_list->current->main_priority) {
      fVar2 = other_list->current->main_priority;
      pfVar1 = &this->current->main_priority;
      if (((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) ||
         ((this->current->second_priority <= other_list->current->second_priority &&
          ((other_list->current->second_priority != this->current->second_priority ||
           (this->current->third_priority < other_list->current->third_priority)))))) {
        Am_Object::operator=(inter,&other_list->current->obj);
        *priority = other_list->current->main_priority;
        other_list->current = other_list->current->next;
        return true;
      }
    }
    Am_Object::operator=(inter,&this->current->obj);
    *priority = this->current->main_priority;
    this->current = this->current->next;
  }
  return true;
}

Assistant:

bool
Am_Priority_List::Two_List_Get_Next(Am_Priority_List *other_list,
                                    Am_Object &inter, float &priority)
{
  if (current) {
    if (other_list && other_list->current) {
      //then have to check the priorities
      if (other_list->current->main_priority < current->main_priority ||
          (other_list->current->main_priority == current->main_priority &&
           (other_list->current->second_priority < current->second_priority ||
            (other_list->current->second_priority == current->second_priority &&
             other_list->current->third_priority <=
                 current->third_priority)))) {
        //then other is lower, I am higher
        inter = current->obj;
        priority = current->main_priority;
        current = current->next;
      } else { //other is higher
        inter = other_list->current->obj;
        priority = other_list->current->main_priority;
        other_list->current = other_list->current->next;
      }
    } else { // current but not other current, return my next item
      inter = current->obj;
      priority = current->main_priority;
      current = current->next;
    }
  } else { // not current
    if (other_list && other_list->current) {
      inter = other_list->current->obj;
      priority = other_list->current->main_priority;
      other_list->current = other_list->current->next;
    } else // neither has current value
      return false;
  }
  //if get here, then OK
  return true;
}